

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,long,long,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>,std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>>
::load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul>
          (argument_loader<pybind11::detail::value_and_holder&,long,long,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>>
           *this,long call)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  bool bVar4;
  char local_16 [6];
  
  puVar2 = *(undefined8 **)(call + 8);
  uVar1 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x48) = *puVar2;
  type_caster<long,_void>::load
            ((type_caster<long,_void> *)(this + 0x40),(PyObject *)puVar2[1],
             SUB41((uVar1 & 2) >> 1,0));
  type_caster<long,_void>::load
            ((type_caster<long,_void> *)(this + 0x38),*(PyObject **)(*(long *)(call + 8) + 0x10),
             SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  type_caster<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_void>::load
            ((type_caster<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_void> *)(this + 0x28),
             *(PyObject **)(*(long *)(call + 8) + 0x18),SUB41((**(uint **)(call + 0x20) & 8) >> 3,0)
            );
  type_caster<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_void>::load
            ((type_caster<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_void> *)(this + 0x18),
             *(PyObject **)(*(long *)(call + 8) + 0x20),
             SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
  list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>
  ::load((list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>
          *)this,*(PyObject **)(*(long *)(call + 8) + 0x28),
         SUB41((**(uint **)(call + 0x20) & 0x20) >> 5,0));
  lVar3 = 0;
  do {
    if (local_16[lVar3] != '\x01') {
      return (bool)local_16[lVar3];
    }
    bVar4 = lVar3 != 5;
    lVar3 = lVar3 + 1;
  } while (bVar4);
  return true;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }